

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_qmfb.c
# Opt level: O1

int jpc_ns_analyze(jpc_fix_t *a,int xstart,int ystart,int width,int height,int stride)

{
  jpc_fix_t *pjVar1;
  jpc_fix_t *pjVar2;
  jpc_fix_t *pjVar3;
  ulong uVar4;
  jpc_fix_t *pjVar5;
  long *plVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  long *plVar13;
  uint uVar14;
  int iVar15;
  jpc_fix_t *pjVar16;
  jpc_fix_t *pjVar17;
  long *plVar18;
  uint uVar19;
  uint uVar20;
  long lVar21;
  int iVar22;
  uint uVar23;
  uint n_2;
  int iVar24;
  jpc_fix_t *pjVar25;
  uint uVar26;
  uint llen;
  jpc_fix_t *local_88;
  uint local_78;
  jpc_fix_t *local_70;
  
  uVar23 = ystart & 1;
  uVar8 = width & 0xfffffff0;
  local_78 = ystart & 1;
  pjVar25 = a;
  if (uVar8 != 0) {
    uVar9 = (height - uVar23) + 1;
    uVar14 = uVar9 >> 1;
    uVar4 = (ulong)(uVar14 * stride);
    iVar10 = height - uVar14;
    uVar19 = height & 1;
    iVar24 = (iVar10 - uVar23) - (uint)(uVar19 == uVar23);
    iVar15 = (uVar14 - (uVar23 == 0)) - (uint)(uVar19 != uVar23);
    pjVar16 = a + uVar4;
    local_88 = a + (uint)stride;
    local_70 = a + (uint)stride + uVar4;
    uVar23 = 0;
    do {
      jpc_qmfb_split_colgrp(pjVar25,height,stride,ystart & 1);
      if (1 < (uint)height) {
        pjVar2 = pjVar25 + uVar4;
        iVar22 = iVar24;
        pjVar5 = pjVar2;
        pjVar3 = pjVar25;
        pjVar17 = local_88;
        if (local_78 != 0) {
          lVar12 = 0;
          do {
            pjVar16[lVar12] = pjVar16[lVar12] + (pjVar25[lVar12] * -0x6583 >> 0xd);
            lVar12 = lVar12 + 1;
          } while ((int)lVar12 != 0x10);
          pjVar5 = pjVar2 + (uint)stride;
        }
        for (; iVar22 != 0; iVar22 = iVar22 + -1) {
          lVar12 = 0;
          do {
            pjVar5[lVar12] = pjVar5[lVar12] + ((pjVar17[lVar12] + pjVar3[lVar12]) * -0x32c1 >> 0xd);
            lVar12 = lVar12 + 1;
          } while ((int)lVar12 != 0x10);
          pjVar5 = pjVar5 + (uint)stride;
          pjVar3 = pjVar3 + (uint)stride;
          pjVar17 = pjVar17 + (uint)stride;
        }
        if (uVar19 == local_78) {
          lVar12 = 0;
          do {
            pjVar5[lVar12] = pjVar5[lVar12] + (pjVar3[lVar12] * -0x6583 >> 0xd);
            lVar12 = lVar12 + 1;
          } while ((int)lVar12 != 0x10);
        }
        iVar22 = iVar15;
        pjVar5 = pjVar2;
        pjVar3 = pjVar25;
        pjVar17 = pjVar16;
        pjVar1 = local_70;
        if (local_78 == 0) {
          lVar12 = 0;
          do {
            pjVar25[lVar12] = pjVar25[lVar12] + (pjVar16[lVar12] * -0x364 >> 0xd);
            lVar12 = lVar12 + 1;
          } while ((int)lVar12 != 0x10);
          pjVar3 = pjVar25 + (uint)stride;
        }
        for (; iVar22 != 0; iVar22 = iVar22 + -1) {
          lVar12 = 0;
          do {
            pjVar3[lVar12] = pjVar3[lVar12] + ((pjVar1[lVar12] + pjVar17[lVar12]) * -0x1b2 >> 0xd);
            lVar12 = lVar12 + 1;
          } while ((int)lVar12 != 0x10);
          pjVar5 = pjVar17 + (uint)stride;
          pjVar3 = pjVar3 + (uint)stride;
          pjVar17 = pjVar17 + (uint)stride;
          pjVar1 = pjVar1 + (uint)stride;
        }
        if (uVar19 != local_78) {
          lVar12 = 0;
          do {
            pjVar3[lVar12] = pjVar3[lVar12] + (pjVar5[lVar12] * -0x364 >> 0xd);
            lVar12 = lVar12 + 1;
          } while ((int)lVar12 != 0x10);
        }
        iVar22 = iVar24;
        pjVar5 = pjVar2;
        pjVar3 = pjVar25;
        pjVar17 = local_88;
        if (local_78 != 0) {
          lVar12 = 0;
          do {
            pjVar16[lVar12] = pjVar16[lVar12] + (pjVar25[lVar12] * 0x3881 >> 0xd);
            lVar12 = lVar12 + 1;
          } while ((int)lVar12 != 0x10);
          pjVar5 = pjVar2 + (uint)stride;
        }
        for (; iVar22 != 0; iVar22 = iVar22 + -1) {
          lVar12 = 0;
          do {
            pjVar5[lVar12] = pjVar5[lVar12] + ((pjVar17[lVar12] + pjVar3[lVar12]) * 0x1c40 >> 0xd);
            lVar12 = lVar12 + 1;
          } while ((int)lVar12 != 0x10);
          pjVar5 = pjVar5 + (uint)stride;
          pjVar3 = pjVar3 + (uint)stride;
          pjVar17 = pjVar17 + (uint)stride;
        }
        if (uVar19 == local_78) {
          lVar12 = 0;
          do {
            pjVar5[lVar12] = pjVar5[lVar12] + (pjVar3[lVar12] * 0x3881 >> 0xd);
            lVar12 = lVar12 + 1;
          } while ((int)lVar12 != 0x10);
        }
        iVar22 = iVar15;
        pjVar5 = pjVar25;
        pjVar3 = pjVar16;
        pjVar17 = local_70;
        if (local_78 == 0) {
          lVar12 = 0;
          do {
            pjVar25[lVar12] = pjVar25[lVar12] + (pjVar16[lVar12] * 0x1c62 >> 0xd);
            lVar12 = lVar12 + 1;
          } while ((int)lVar12 != 0x10);
          pjVar5 = pjVar25 + (uint)stride;
        }
        for (; iVar22 != 0; iVar22 = iVar22 + -1) {
          lVar12 = 0;
          do {
            pjVar5[lVar12] = pjVar5[lVar12] + ((pjVar17[lVar12] + pjVar3[lVar12]) * 0xe31 >> 0xd);
            lVar12 = lVar12 + 1;
          } while ((int)lVar12 != 0x10);
          pjVar2 = pjVar3 + (uint)stride;
          pjVar5 = pjVar5 + (uint)stride;
          pjVar3 = pjVar2;
          pjVar17 = pjVar17 + (uint)stride;
        }
        if (uVar19 != local_78) {
          lVar12 = 0;
          do {
            pjVar5[lVar12] = pjVar5[lVar12] + (pjVar2[lVar12] * 0x1c62 >> 0xd);
            lVar12 = lVar12 + 1;
          } while ((int)lVar12 != 0x10);
        }
        pjVar3 = pjVar25;
        uVar11 = uVar14;
        iVar22 = iVar10;
        pjVar5 = pjVar16;
        if (1 < uVar9) {
          do {
            lVar12 = 0;
            do {
              pjVar3[lVar12] = pjVar3[lVar12] * 0x1a03 >> 0xd;
              lVar12 = lVar12 + 1;
            } while ((int)lVar12 != 0x10);
            uVar11 = uVar11 - 1;
            pjVar3 = pjVar3 + (uint)stride;
          } while (uVar11 != 0);
        }
        for (; iVar22 != 0; iVar22 = iVar22 + -1) {
          lVar12 = 0;
          do {
            pjVar5[lVar12] = pjVar5[lVar12] * 0x13ae >> 0xd;
            lVar12 = lVar12 + 1;
          } while ((int)lVar12 != 0x10);
          pjVar5 = pjVar5 + (uint)stride;
        }
      }
      pjVar25 = pjVar25 + 0x10;
      uVar23 = uVar23 + 0x10;
      pjVar16 = pjVar16 + 0x10;
      local_88 = local_88 + 0x10;
      local_70 = local_70 + 0x10;
    } while (uVar23 < uVar8);
  }
  if (uVar8 != width) {
    uVar8 = width & 0xf;
    jpc_qmfb_split_colres(pjVar25,height,uVar8,stride,ystart & 1);
    if (1 < (uint)height) {
      uVar23 = (local_78 ^ 1) + height;
      uVar9 = uVar23 >> 1;
      uVar4 = (ulong)(uVar9 * stride);
      pjVar5 = pjVar25 + uVar4;
      pjVar16 = pjVar5;
      if (local_78 != 0) {
        if (uVar8 != 0) {
          lVar12 = 0;
          do {
            pjVar5[lVar12] = pjVar5[lVar12] + (pjVar25[lVar12] * -0x6583 >> 0xd);
            lVar12 = lVar12 + 1;
          } while (uVar8 != (uint)lVar12);
        }
        pjVar16 = pjVar5 + (uint)stride;
      }
      iVar10 = height - uVar9;
      uVar14 = height & 1;
      iVar15 = (iVar10 - local_78) - (uint)(uVar14 == local_78);
      pjVar3 = pjVar25;
      if (iVar15 != 0) {
        iVar24 = iVar15;
        pjVar17 = pjVar25;
        do {
          pjVar17 = pjVar17 + (uint)stride;
          if (uVar8 != 0) {
            lVar12 = 0;
            do {
              pjVar16[lVar12] =
                   pjVar16[lVar12] + ((pjVar17[lVar12] + pjVar3[lVar12]) * -0x32c1 >> 0xd);
              lVar12 = lVar12 + 1;
            } while (uVar8 != (uint)lVar12);
          }
          pjVar16 = pjVar16 + (uint)stride;
          pjVar3 = pjVar3 + (uint)stride;
          iVar24 = iVar24 + -1;
        } while (iVar24 != 0);
      }
      if (uVar8 != 0 && uVar14 == local_78) {
        lVar12 = 0;
        do {
          pjVar16[lVar12] = pjVar16[lVar12] + (pjVar3[lVar12] * -0x6583 >> 0xd);
          lVar12 = lVar12 + 1;
        } while (uVar8 != (uint)lVar12);
      }
      pjVar16 = pjVar25;
      if (local_78 == 0) {
        if (uVar8 != 0) {
          lVar12 = 0;
          do {
            pjVar25[lVar12] = pjVar25[lVar12] + (pjVar5[lVar12] * -0x364 >> 0xd);
            lVar12 = lVar12 + 1;
          } while (uVar8 != (uint)lVar12);
        }
        pjVar16 = pjVar25 + (uint)stride;
      }
      iVar24 = (uVar9 - (local_78 == 0)) - (uint)(uVar14 != local_78);
      pjVar3 = pjVar5;
      if (iVar24 != 0) {
        pjVar17 = pjVar25 + (uint)stride + uVar4;
        iVar22 = iVar24;
        do {
          if (uVar8 != 0) {
            lVar12 = 0;
            do {
              pjVar16[lVar12] =
                   pjVar16[lVar12] + ((pjVar17[lVar12] + pjVar3[lVar12]) * -0x1b2 >> 0xd);
              lVar12 = lVar12 + 1;
            } while (uVar8 != (uint)lVar12);
          }
          pjVar16 = pjVar16 + (uint)stride;
          pjVar3 = pjVar3 + (uint)stride;
          pjVar17 = pjVar17 + (uint)stride;
          iVar22 = iVar22 + -1;
        } while (iVar22 != 0);
      }
      if (uVar8 != 0 && uVar14 != local_78) {
        lVar12 = 0;
        do {
          pjVar16[lVar12] = pjVar16[lVar12] + (pjVar3[lVar12] * -0x364 >> 0xd);
          lVar12 = lVar12 + 1;
        } while (uVar8 != (uint)lVar12);
      }
      pjVar16 = pjVar5;
      if (local_78 != 0) {
        if (uVar8 != 0) {
          lVar12 = 0;
          do {
            pjVar5[lVar12] = pjVar5[lVar12] + (pjVar25[lVar12] * 0x3881 >> 0xd);
            lVar12 = lVar12 + 1;
          } while (uVar8 != (uint)lVar12);
        }
        pjVar16 = pjVar5 + (uint)stride;
      }
      pjVar3 = pjVar25;
      if (iVar15 != 0) {
        pjVar17 = pjVar25;
        do {
          pjVar17 = pjVar17 + (uint)stride;
          if (uVar8 != 0) {
            lVar12 = 0;
            do {
              pjVar16[lVar12] =
                   pjVar16[lVar12] + ((pjVar17[lVar12] + pjVar3[lVar12]) * 0x1c40 >> 0xd);
              lVar12 = lVar12 + 1;
            } while (uVar8 != (uint)lVar12);
          }
          pjVar16 = pjVar16 + (uint)stride;
          pjVar3 = pjVar3 + (uint)stride;
          iVar15 = iVar15 + -1;
        } while (iVar15 != 0);
      }
      if (uVar8 != 0 && uVar14 == local_78) {
        lVar12 = 0;
        do {
          pjVar16[lVar12] = pjVar16[lVar12] + (pjVar3[lVar12] * 0x3881 >> 0xd);
          lVar12 = lVar12 + 1;
        } while (uVar8 != (uint)lVar12);
      }
      pjVar16 = pjVar25;
      if (local_78 == 0) {
        if (uVar8 != 0) {
          lVar12 = 0;
          do {
            pjVar25[lVar12] = pjVar25[lVar12] + (pjVar5[lVar12] * 0x1c62 >> 0xd);
            lVar12 = lVar12 + 1;
          } while (uVar8 != (uint)lVar12);
        }
        pjVar16 = pjVar25 + (uint)stride;
      }
      pjVar3 = pjVar5;
      if (iVar24 != 0) {
        pjVar17 = pjVar25 + (uint)stride + uVar4;
        do {
          if (uVar8 != 0) {
            lVar12 = 0;
            do {
              pjVar16[lVar12] =
                   pjVar16[lVar12] + ((pjVar17[lVar12] + pjVar3[lVar12]) * 0xe31 >> 0xd);
              lVar12 = lVar12 + 1;
            } while (uVar8 != (uint)lVar12);
          }
          pjVar16 = pjVar16 + (uint)stride;
          pjVar3 = pjVar3 + (uint)stride;
          pjVar17 = pjVar17 + (uint)stride;
          iVar24 = iVar24 + -1;
        } while (iVar24 != 0);
      }
      if (uVar8 != 0 && uVar14 != local_78) {
        lVar12 = 0;
        do {
          pjVar16[lVar12] = pjVar16[lVar12] + (pjVar3[lVar12] * 0x1c62 >> 0xd);
          lVar12 = lVar12 + 1;
        } while (uVar8 != (uint)lVar12);
      }
      if (1 < uVar23) {
        do {
          if (uVar8 != 0) {
            lVar12 = 0;
            do {
              pjVar25[lVar12] = pjVar25[lVar12] * 0x1a03 >> 0xd;
              lVar12 = lVar12 + 1;
            } while (uVar8 != (uint)lVar12);
          }
          pjVar25 = pjVar25 + (uint)stride;
          uVar9 = uVar9 - 1;
        } while (uVar9 != 0);
      }
      if (iVar10 != 0) {
        do {
          if (uVar8 != 0) {
            lVar12 = 0;
            do {
              pjVar5[lVar12] = pjVar5[lVar12] * 0x13ae >> 0xd;
              lVar12 = lVar12 + 1;
            } while (uVar8 != (uint)lVar12);
          }
          pjVar5 = pjVar5 + (uint)stride;
          iVar10 = iVar10 + -1;
        } while (iVar10 != 0);
      }
    }
  }
  if (height != 0) {
    uVar14 = xstart & 1;
    uVar23 = (uVar14 ^ 1) + width;
    uVar19 = uVar23 >> 1;
    uVar4 = (ulong)uVar19;
    uVar26 = (width - uVar19) - uVar14;
    uVar11 = width & 1;
    uVar8 = (uint)(uVar11 == uVar14);
    uVar9 = uVar19 - (uVar14 == 0);
    uVar20 = (uint)(uVar11 != uVar14);
    iVar15 = (uVar20 - uVar19) + (uint)(uVar14 == 0);
    pjVar25 = a + uVar4;
    iVar10 = 0;
    do {
      jpc_qmfb_split_row(a,width,uVar14);
      if (1 < (uint)width) {
        plVar6 = a + uVar4;
        plVar13 = plVar6;
        if (uVar14 != 0) {
          *plVar6 = *plVar6 + (*a * -0x6583 >> 0xd);
          plVar13 = plVar6 + 1;
        }
        plVar18 = a;
        if (uVar26 != uVar8) {
          lVar21 = 0;
          lVar12 = 0;
          do {
            plVar13[lVar12] = plVar13[lVar12] + ((a[lVar12 + 1] + a[lVar12]) * -0x32c1 >> 0xd);
            lVar12 = lVar12 + 1;
            lVar21 = lVar21 + -8;
          } while (uVar26 - uVar8 != (int)lVar12);
          plVar13 = (long *)((long)plVar13 - lVar21);
          plVar18 = (long *)((long)a - lVar21);
        }
        if (uVar11 == uVar14) {
          *plVar13 = *plVar13 + (*plVar18 * -0x6583 >> 0xd);
        }
        plVar13 = a;
        if (uVar14 == 0) {
          *a = *a + (*plVar6 * -0x364 >> 0xd);
          plVar13 = a + 1;
        }
        plVar18 = plVar6;
        if (uVar9 != uVar20) {
          lVar21 = 0;
          lVar12 = 0;
          do {
            plVar13[lVar12] =
                 plVar13[lVar12] + ((pjVar25[lVar12 + 1] + pjVar25[lVar12]) * -0x1b2 >> 0xd);
            lVar12 = lVar12 + 1;
            lVar21 = lVar21 + -8;
          } while ((int)lVar12 + iVar15 != 0);
          plVar13 = (long *)((long)plVar13 - lVar21);
          plVar18 = (long *)((long)pjVar25 - lVar21);
        }
        if (uVar11 != uVar14) {
          *plVar13 = *plVar13 + (*plVar18 * -0x364 >> 0xd);
        }
        plVar13 = plVar6;
        if (uVar14 != 0) {
          *plVar6 = *plVar6 + (*a * 0x3881 >> 0xd);
          plVar13 = plVar6 + 1;
        }
        plVar18 = a;
        if (uVar26 != uVar8) {
          lVar21 = 0;
          lVar12 = 0;
          do {
            plVar13[lVar12] = plVar13[lVar12] + ((a[lVar12 + 1] + a[lVar12]) * 0x1c40 >> 0xd);
            lVar12 = lVar12 + 1;
            lVar21 = lVar21 + -8;
          } while (uVar26 - uVar8 != (int)lVar12);
          plVar13 = (long *)((long)plVar13 - lVar21);
          plVar18 = (long *)((long)a - lVar21);
        }
        if (uVar11 == uVar14) {
          *plVar13 = *plVar13 + (*plVar18 * 0x3881 >> 0xd);
        }
        plVar13 = a;
        if (uVar14 == 0) {
          *a = *a + (*plVar6 * 0x1c62 >> 0xd);
          plVar13 = a + 1;
        }
        if (uVar9 != uVar20) {
          lVar21 = 0;
          lVar12 = 0;
          do {
            plVar13[lVar12] =
                 plVar13[lVar12] + ((pjVar25[lVar12 + 1] + pjVar25[lVar12]) * 0xe31 >> 0xd);
            lVar12 = lVar12 + 1;
            lVar21 = lVar21 + -8;
          } while ((int)lVar12 + iVar15 != 0);
          plVar13 = (long *)((long)plVar13 - lVar21);
          plVar6 = (long *)((long)pjVar25 - lVar21);
        }
        if (uVar11 != uVar14) {
          *plVar13 = *plVar13 + (*plVar6 * 0x1c62 >> 0xd);
        }
        if (1 < uVar23) {
          lVar12 = 0;
          do {
            a[lVar12] = a[lVar12] * 0x1a03 >> 0xd;
            lVar12 = lVar12 + 1;
          } while (uVar19 != (uint)lVar12);
        }
        uVar7 = uVar4;
        if (width - uVar19 != 0) {
          do {
            a[uVar7] = a[uVar7] * 0x13ae >> 0xd;
            uVar7 = uVar7 + 1;
          } while (width != (int)uVar7);
        }
      }
      a = a + stride;
      iVar10 = iVar10 + 1;
      pjVar25 = pjVar25 + stride;
    } while (iVar10 != height);
  }
  return 0;
}

Assistant:

int jpc_ns_analyze(jpc_fix_t *a, int xstart, int ystart, int width, int height,
  int stride)
{

	const unsigned numrows = height;
	const unsigned numcols = width;
	const unsigned rowparity = ystart & 1;
	const unsigned colparity = xstart & 1;
	jpc_fix_t *startptr;

	const unsigned maxcols = (numcols / JPC_QMFB_COLGRPSIZE) * JPC_QMFB_COLGRPSIZE;
	startptr = &a[0];
	for (unsigned i = 0; i < maxcols; i += JPC_QMFB_COLGRPSIZE) {
		jpc_qmfb_split_colgrp(startptr, numrows, stride, rowparity);
		jpc_ns_fwdlift_colgrp(startptr, numrows, stride, rowparity);
		startptr += JPC_QMFB_COLGRPSIZE;
	}
	if (maxcols < numcols) {
		jpc_qmfb_split_colres(startptr, numrows, numcols - maxcols, stride,
		  rowparity);
		jpc_ns_fwdlift_colres(startptr, numrows, numcols - maxcols, stride,
		  rowparity);
	}

	startptr = &a[0];
	for (unsigned i = 0; i < numrows; ++i) {
		jpc_qmfb_split_row(startptr, numcols, colparity);
		jpc_ns_fwdlift_row(startptr, numcols, colparity);
		startptr += stride;
	}

	return 0;

}